

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool google::protobuf::anon_unknown_1::RetrieveOptions
               (int depth,Message *options,DescriptorPool *pool,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  Tables *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Message *pMVar3;
  MessageLite *this_00;
  LogMessage *pLVar4;
  undefined4 extraout_var_02;
  char *__function;
  MessageLite *options_00;
  Symbol SVar5;
  DynamicMessageFactory factory;
  LogFinisher local_89;
  undefined1 local_88 [56];
  DynamicMessageFactory local_50;
  undefined4 extraout_var_01;
  
  iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
  if (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) + 0x10) != pool) {
    iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
    this = (pool->tables_).ptr_;
    if (this == (Tables *)0x0) {
      __function = 
      "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
      ;
    }
    else {
      SVar5 = DescriptorPool::Tables::FindByNameHelper
                        (this,pool,*(string **)(CONCAT44(extraout_var_00,iVar2) + 8));
      if (SVar5.field_1.descriptor == (Descriptor *)0x0 || SVar5.type != MESSAGE) goto LAB_002edaf4;
      DynamicMessageFactory::DynamicMessageFactory(&local_50);
      pMVar3 = DynamicMessageFactory::GetPrototype(&local_50,SVar5.field_1.descriptor);
      iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
      this_00 = (MessageLite *)CONCAT44(extraout_var_01,iVar2);
      if (this_00 != (MessageLite *)0x0) {
        MessageLite::SerializeAsString_abi_cxx11_((string *)local_88,&options->super_MessageLite);
        bVar1 = MessageLite::ParseFromString(this_00,(string *)local_88);
        if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
          operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
        }
        options_00 = this_00;
        if (!bVar1) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_88,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x888);
          pLVar4 = internal::LogMessage::operator<<
                             ((LogMessage *)local_88,"Found invalid proto option data for: ");
          iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
          pLVar4 = internal::LogMessage::operator<<
                             (pLVar4,*(string **)(CONCAT44(extraout_var_02,iVar2) + 8));
          internal::LogFinisher::operator=(&local_89,pLVar4);
          internal::LogMessage::~LogMessage((LogMessage *)local_88);
          options_00 = &options->super_MessageLite;
        }
        bVar1 = RetrieveOptionsAssumingRightPool(depth,(Message *)options_00,option_entries);
        (*this_00->_vptr_MessageLite[1])(this_00);
        DynamicMessageFactory::~DynamicMessageFactory(&local_50);
        return bVar1;
      }
      __function = 
      "C *google::protobuf::internal::scoped_ptr<google::protobuf::Message>::operator->() const [C = google::protobuf::Message]"
      ;
    }
    __assert_fail("ptr_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                  ,0x5f,__function);
  }
LAB_002edaf4:
  bVar1 = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
  return bVar1;
}

Assistant:

bool RetrieveOptions(int depth, const Message& options,
                     const DescriptorPool* pool,
                     std::vector<string>* option_entries) {
  // When printing custom options for a descriptor, we must use an options
  // message built on top of the same DescriptorPool where the descriptor
  // is coming from. This is to ensure we are interpreting custom options
  // against the right pool.
  if (options.GetDescriptor()->file()->pool() == pool) {
    return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
  } else {
    const Descriptor* option_descriptor =
        pool->FindMessageTypeByName(options.GetDescriptor()->full_name());
    if (option_descriptor == NULL) {
      // google/protobuf/descriptor.proto is not in the pool. This means no
      // custom options are used so we are safe to proceed with the compiled
      // options message type.
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
    DynamicMessageFactory factory;
    google::protobuf::scoped_ptr<Message> dynamic_options(
        factory.GetPrototype(option_descriptor)->New());
    if (dynamic_options->ParseFromString(options.SerializeAsString())) {
      return RetrieveOptionsAssumingRightPool(depth, *dynamic_options,
                                              option_entries);
    } else {
      GOOGLE_LOG(ERROR) << "Found invalid proto option data for: "
                 << options.GetDescriptor()->full_name();
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
  }
}